

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall QtPrivate::QCalendarView::keyPressEvent(QCalendarView *this,QKeyEvent *event)

{
  if ((this->readOnly == false) &&
     ((*(int *)(event + 0x40) + 0xfefffffcU < 2 || (*(int *)(event + 0x40) == 0x1010000)))) {
    QMetaObject::activate((QObject *)this,&staticMetaObject,3,(void **)0x0);
    return;
  }
  QAbstractItemView::keyPressEvent((QAbstractItemView *)this,event);
  return;
}

Assistant:

void QCalendarView::keyPressEvent(QKeyEvent *event)
{
#ifdef QT_KEYPAD_NAVIGATION
    if (event->key() == Qt::Key_Select) {
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            if (!hasEditFocus()) {
                setEditFocus(true);
                return;
            }
        }
    } else if (event->key() == Qt::Key_Back) {
        if (QApplicationPrivate::keypadNavigationEnabled() && hasEditFocus()) {
            if (qobject_cast<QCalendarModel *>(model())) {
                emit changeDate(origDate, true); //changes selection back to origDate, but doesn't activate
                setEditFocus(false);
                return;
            }
        }
    }
#endif

    if (!readOnly) {
        switch (event->key()) {
            case Qt::Key_Return:
            case Qt::Key_Enter:
            case Qt::Key_Select:
                emit editingFinished();
                return;
            default:
                break;
        }
    }
    QTableView::keyPressEvent(event);
}